

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadlib.c
# Opt level: O0

char * searchpath(lua_State *L,char *name,char *path,char *sep,char *dirsep)

{
  int iVar1;
  char *pcVar2;
  char *filename;
  luaL_Buffer msg;
  char *dirsep_local;
  char *sep_local;
  char *path_local;
  char *name_local;
  lua_State *L_local;
  
  msg.initb._8184_8_ = dirsep;
  luaL_buffinit(L,(luaL_Buffer *)&filename);
  sep_local = path;
  path_local = name;
  if (*sep != '\0') {
    path_local = luaL_gsub(L,name,sep,(char *)msg.initb._8184_8_);
  }
  while( true ) {
    sep_local = pushnexttemplate(L,sep_local);
    if (sep_local == (char *)0x0) {
      luaL_pushresult((luaL_Buffer *)&filename);
      return (char *)0x0;
    }
    pcVar2 = lua_tolstring(L,-1,(size_t *)0x0);
    pcVar2 = luaL_gsub(L,pcVar2,"?",path_local);
    lua_rotate(L,-2,-1);
    lua_settop(L,-2);
    iVar1 = readable(pcVar2);
    if (iVar1 != 0) break;
    lua_pushfstring(L,"\n\tno file \'%s\'",pcVar2);
    lua_rotate(L,-2,-1);
    lua_settop(L,-2);
    luaL_addvalue((luaL_Buffer *)&filename);
  }
  return pcVar2;
}

Assistant:

static const char *searchpath (lua_State *L, const char *name,
                                             const char *path,
                                             const char *sep,
                                             const char *dirsep) {
  luaL_Buffer msg;  /* to build error message */
  luaL_buffinit(L, &msg);
  if (*sep != '\0')  /* non-empty separator? */
    name = luaL_gsub(L, name, sep, dirsep);  /* replace it by 'dirsep' */
  while ((path = pushnexttemplate(L, path)) != NULL) {
    const char *filename = luaL_gsub(L, lua_tostring(L, -1),
                                     LUA_PATH_MARK, name);
    lua_remove(L, -2);  /* remove path template */
    if (readable(filename))  /* does file exist and is readable? */
      return filename;  /* return that file name */
    lua_pushfstring(L, "\n\tno file '%s'", filename);
    lua_remove(L, -2);  /* remove file name */
    luaL_addvalue(&msg);  /* concatenate error msg. entry */
  }
  luaL_pushresult(&msg);  /* create error message */
  return NULL;  /* not found */
}